

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

bool __thiscall
VulkanHppGenerator::determineEnumeration
          (VulkanHppGenerator *this,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams)

{
  pointer puVar1;
  pointer puVar2;
  _Rb_tree_node_base *p_Var3;
  pointer puVar4;
  _Rb_tree_header *p_Var5;
  
  p_Var3 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(vectorParams->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    puVar1 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    do {
      if (puVar1 != puVar2) {
        puVar4 = puVar1;
LAB_0013c328:
        if (*puVar4 != *(unsigned_long *)(p_Var3 + 1)) goto code_r0x0013c32d;
        if (*(char *)&p_Var3[1]._M_right != '\0') {
          return true;
        }
        puVar4 = puVar1;
        do {
          if ((_Base_ptr)*puVar4 == p_Var3[1]._M_parent) {
            return true;
          }
          puVar4 = puVar4 + 1;
        } while (puVar4 != puVar2);
      }
LAB_0013c355:
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  return false;
code_r0x0013c32d:
  puVar4 = puVar4 + 1;
  if (puVar4 == puVar2) goto LAB_0013c355;
  goto LAB_0013c328;
}

Assistant:

bool VulkanHppGenerator::determineEnumeration( std::map<size_t, VectorParamData> const & vectorParams, std::vector<size_t> const & returnParams ) const
{
  // a command is considered to be enumerating some data, if for at least one vectorParam the data is a returnParam and either the vectorParams is
  // specified by a structure or the lenParam is a returnParam as well
  return std::ranges::any_of( vectorParams,
                              [&returnParams]( auto const & vp )
                              {
                                return std::ranges::any_of( returnParams, [&vp]( size_t rp ) { return rp == vp.first; } ) &&
                                       ( vp.second.byStructure ||
                                         std::ranges::any_of( returnParams, [&vp]( size_t rp ) { return rp == vp.second.lenParam; } ) );
                              } );
}